

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IR.h
# Opt level: O0

void __thiscall
CapturedValues::CopyTo(CapturedValues *this,JitArenaAllocator *allocator,CapturedValues *other)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  BVSparse<Memory::JitArenaAllocator> *pBVar4;
  CapturedValues *other_local;
  JitArenaAllocator *allocator_local;
  CapturedValues *this_local;
  
  if (other == (CapturedValues *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.h"
                       ,0x3b,"(other != nullptr)","other != nullptr");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  SListBase<JsUtil::KeyValuePair<StackSym_*,_BailoutConstantValue>,_Memory::ArenaAllocator,_RealCount>
  ::CopyTo(&this->constantValues,&allocator->super_ArenaAllocator,&other->constantValues);
  SListBase<JsUtil::KeyValuePair<StackSym_*,_StackSym_*>,_Memory::ArenaAllocator,_RealCount>::CopyTo
            (&this->copyPropSyms,&allocator->super_ArenaAllocator,&other->copyPropSyms);
  if (other->argObjSyms != (BVSparse<Memory::JitArenaAllocator> *)0x0) {
    BVSparse<Memory::JitArenaAllocator>::ClearAll(other->argObjSyms);
    Memory::
    DeleteObject<Memory::JitArenaAllocator,(Memory::AllocatorDeleteFlags)0,BVSparse<Memory::JitArenaAllocator>>
              (allocator,other->argObjSyms);
  }
  if (this->argObjSyms == (BVSparse<Memory::JitArenaAllocator> *)0x0) {
    other->argObjSyms = (BVSparse<Memory::JitArenaAllocator> *)0x0;
  }
  else {
    pBVar4 = BVSparse<Memory::JitArenaAllocator>::CopyNew(this->argObjSyms,allocator);
    other->argObjSyms = pBVar4;
  }
  return;
}

Assistant:

void CopyTo(JitArenaAllocator *allocator, CapturedValues *other) const
    {
        Assert(other != nullptr);
        this->constantValues.CopyTo(allocator, other->constantValues);
        this->copyPropSyms.CopyTo(allocator, other->copyPropSyms);

        if (other->argObjSyms != nullptr)
        {
            other->argObjSyms->ClearAll();
            JitAdelete(allocator, other->argObjSyms);
        }

        if (this->argObjSyms != nullptr)
        {
            other->argObjSyms = this->argObjSyms->CopyNew(allocator);
        }
        else
        {
            other->argObjSyms = nullptr;
        }

        // Ignore refCount because other objects might still reference it
    }